

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O2

bool __thiscall QPixmap::save(QPixmap *this,QString *fileName,char *format,int quality)

{
  long lVar1;
  QPlatformPixmap *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  QImageWriter writer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->data).d.ptr;
  if ((pQVar2 == (QPlatformPixmap *)0x0) || (pQVar2->is_null != false)) {
    bVar3 = false;
  }
  else {
    writer.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_50,format,-1);
    QImageWriter::QImageWriter(&writer,fileName,(QByteArray *)&local_50);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    bVar3 = doImageIO(this,&writer,quality);
    QImageWriter::~QImageWriter(&writer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QPixmap::save(const QString &fileName, const char *format, int quality) const
{
    if (isNull())
        return false;                                // nothing to save
    QImageWriter writer(fileName, format);
    return doImageIO(&writer, quality);
}